

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
nlohmann::json_schema::json_validator::json_validator
          (json_validator *this,json *schema,schema_loader *loader,format_checker *format,
          content_checker *content)

{
  _Manager_type p_Var1;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = loader->_M_invoker;
  p_Var1 = (loader->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(loader->super__Function_base)._M_functor
    ;
    local_38._8_8_ = *(undefined8 *)((long)&(loader->super__Function_base)._M_functor + 8);
    (loader->super__Function_base)._M_manager = (_Manager_type)0x0;
    loader->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = format->_M_invoker;
  p_Var1 = (format->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(format->super__Function_base)._M_functor
    ;
    local_58._8_8_ = *(undefined8 *)((long)&(format->super__Function_base)._M_functor + 8);
    (format->super__Function_base)._M_manager = (_Manager_type)0x0;
    format->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = content->_M_invoker;
  p_Var1 = (content->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(content->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(content->super__Function_base)._M_functor + 8);
    (content->super__Function_base)._M_manager = (_Manager_type)0x0;
    content->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  json_validator(this,(schema_loader *)&local_38,(format_checker *)&local_58,
                 (content_checker *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  set_root_schema(this,schema);
  return;
}

Assistant:

json_validator::json_validator(json &&schema,
                               schema_loader loader,
                               format_checker format,
                               content_checker content)

    : json_validator(std::move(loader),
                     std::move(format),
                     std::move(content))
{
	set_root_schema(std::move(schema));
}